

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgentRunner.h
# Opt level: O0

void __thiscall
aeron::concurrent::AgentRunner<aeron::ClientConductor,_aeron::concurrent::SleepingIdleStrategy>::
~AgentRunner(AgentRunner<aeron::ClientConductor,_aeron::concurrent::SleepingIdleStrategy> *this)

{
  long in_RDI;
  
  std::__cxx11::string::~string((string *)(in_RDI + 0x28));
  std::thread::~thread((thread *)0x1e299a);
  return;
}

Assistant:

AgentRunner(Agent& agent, IdleStrategy& idleStrategy, logbuffer::exception_handler_t& exceptionHandler) :
        m_agent(agent),
        m_idleStrategy(idleStrategy),
        m_exceptionHandler(exceptionHandler),
        m_running(true),
        m_name("aeron-agent")
    {
    }